

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

int compare_ascending(void *ind1,void *ind2)

{
  int iVar1;
  
  iVar1 = 1;
  if (**ind1 <= **ind2) {
    iVar1 = -(uint)(**ind1 < **ind2);
  }
  return iVar1;
}

Assistant:

int compare_ascending (const void* ind1, const void* ind2)
{
	if (*((vipair *)ind1)->a > *((vipair *)ind2)->a)
		return 1;
	else if (*((vipair *)ind1)->a < *((vipair *)ind2)->a)
		return -1;
	else
		return 0;
}